

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,int64_t value)

{
  ScriptOperator *this_00;
  iterator iVar1;
  ScriptType key;
  ScriptOperator local_50;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_0078ef30;
  this->type_ = kElementNumber;
  this_00 = &this->op_code_;
  ScriptOperator::ScriptOperator(this_00,kOpInvalidOpCode);
  ByteData::ByteData(&this->binary_data_);
  this->value_ = value;
  if (value + 1U < 0x12) {
    if (value == -1) {
      key = kOp1Negate;
    }
    else if (value == 0) {
      key = kOpFalse;
    }
    else {
      key = (int)value + kOpReserved;
    }
    if ((g_operator_map._40_8_ == 0) ||
       (iVar1 = ::std::
                _Rb_tree<cfd::core::ScriptType,_std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                ::find((_Rb_tree<cfd::core::ScriptType,_std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                        *)g_operator_map,&key), iVar1._M_node == (_Base_ptr)(g_operator_map + 8))) {
      ScriptOperator::ScriptOperator(&local_50,key);
      ScriptOperator::operator=(this_00,&local_50);
      ScriptOperator::~ScriptOperator(&local_50);
    }
    else {
      ScriptOperator::operator=(this_00,(ScriptOperator *)&iVar1._M_node[1]._M_parent);
    }
    if ((this->op_code_).data_type_ != kOpInvalidOpCode) {
      this->type_ = kElementOpCode;
    }
  }
  if (this->type_ == kElementNumber) {
    SerializeScriptNum((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key,this->value_);
    ByteData::ByteData((ByteData *)&local_50,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    ByteData::operator=(&this->binary_data_,(ByteData *)&local_50);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(int64_t value)
    : type_(kElementNumber),
      op_code_(kOpInvalidOpCode),
      binary_data_(),
      value_(value) {
  if ((value >= -1) && (value <= 16)) {
    int32_t op_code = static_cast<int32_t>(kOp_0);
    if (value == -1) {
      op_code = static_cast<int32_t>(kOp1Negate);

    } else if (value >= 1) {
      op_code = static_cast<int32_t>(kOp_1);
      op_code += static_cast<int32_t>(value) - 1;
    }

    ScriptType key = static_cast<ScriptType>(op_code);
    bool is_find = false;
    if (!g_operator_map.empty()) {
      decltype(g_operator_map)::const_iterator ite = g_operator_map.find(key);
      if (ite != g_operator_map.end()) {
        op_code_ = ite->second;
        is_find = true;
      }
    }
    if (!is_find) {
      op_code_ = ScriptOperator(key);
    }
    if (op_code_.GetDataType() != kOpInvalidOpCode) {
      type_ = kElementOpCode;
    }
  }

  if (type_ == kElementNumber) {
    // set binary data
    binary_data_ = ByteData(SerializeScriptNum(value_));
  }
}